

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O0

void __thiscall GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad(ArraySrcOpt *this)

{
  StackSym *sym;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  ObjectType OVar4;
  uint uVar5;
  uint uVar6;
  DWORD offset;
  uint32 offset_00;
  uint uVar7;
  undefined4 *puVar8;
  RegOpnd *this_00;
  Opnd *this_01;
  IndirOpnd *pIVar9;
  Instr *this_02;
  JITTimeWorkItem *pJVar10;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  RegOpnd *local_210;
  wchar local_1a8 [4];
  char16 debugStringBuffer_3 [42];
  wchar local_148 [4];
  char16 debugStringBuffer_2 [42];
  Instr *loadHeadSegment;
  Instr *loadObjectArray;
  RegOpnd *jitOptimizedBaseOpnd;
  RegOpnd *headSegmentOpnd;
  char16 debugStringBuffer_1 [42];
  wchar local_68 [4];
  char16 debugStringBuffer [42];
  ArraySrcOpt *this_local;
  
  unique0x10000a0f = this;
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ArraySegmentHoistPhase,uVar5,uVar6);
  if (bVar2) {
    pJVar11 = Func::GetJITFunctionBody(this->func);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_68);
    Output::Print(L"Function %s (%s)",pcVar12,pcVar13);
    bVar2 = Func::IsLoopBody(this->func);
    if (bVar2) {
      pJVar10 = Func::GetWorkItem(this->func);
      uVar5 = JITTimeWorkItem::GetLoopNumber(pJVar10);
      Output::Print(L", loop %u",(ulong)uVar5);
    }
    if ((*this->instr)->m_func != this->func) {
      pJVar11 = Func::GetJITFunctionBody((*this->instr)->m_func);
      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pcVar13 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_68);
      Output::Print(L", Inlinee %s (%s)",pcVar12,pcVar13);
    }
    Output::Print(L" - %s\n    ",0x176ff74);
    IR::Instr::Dump(*this->instr);
    Output::Print(L"    ");
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  uVar5 = Func::GetSourceContextId(this->func);
  uVar6 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ArraySegmentHoistPhase,uVar5,uVar6);
  if (bVar2) {
    pJVar11 = Func::GetJITFunctionBody((*this->instr)->m_func);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])&headSegmentOpnd);
    Output::Print(L"Testtrace: %s function %s (%s): ",0x176ff74,pcVar12,pcVar13);
    Output::Print(L"Separating array segment load\n");
    Output::Flush();
  }
  if (this->newHeadSegmentSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0x648,"(newHeadSegmentSym)","newHeadSegmentSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  sym = this->newHeadSegmentSym;
  IVar3 = StackSym::GetType(this->newHeadSegmentSym);
  this_00 = IR::RegOpnd::New(sym,IVar3,(*this->instr)->m_func);
  IR::Opnd::SetIsJITOptimizedReg(&this_00->super_Opnd,true);
  this_01 = IR::Opnd::Copy(&this->baseOpnd->super_Opnd,(*this->instr)->m_func);
  local_210 = IR::Opnd::AsRegOpnd(this_01);
  IR::Opnd::SetIsJITOptimizedReg(&local_210->super_Opnd,true);
  OVar4 = ValueType::GetObjectType(&this->baseValueType);
  if (OVar4 == ObjectWithArray) {
    offset = Js::DynamicObject::GetOffsetOfObjectArray();
    IVar3 = IR::Opnd::GetType(&local_210->super_Opnd);
    pIVar9 = IR::IndirOpnd::New(local_210,offset,IVar3,(*this->instr)->m_func,false);
    loadHeadSegment =
         IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar9->super_Opnd,(*this->instr)->m_func);
  }
  else {
    loadHeadSegment = (Instr *)0x0;
  }
  if (loadHeadSegment != (Instr *)0x0) {
    local_210 = this_00;
  }
  offset_00 = Lowerer::GetArrayOffsetOfHeadSegment
                        ((ValueType)
                         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                          &(this->baseValueType).field_0.field_0);
  IVar3 = IR::Opnd::GetType(&this_00->super_Opnd);
  pIVar9 = IR::IndirOpnd::New(local_210,offset_00,IVar3,(*this->instr)->m_func,false);
  this_02 = IR::Instr::New(LdIndir,&this_00->super_Opnd,&pIVar9->super_Opnd,(*this->instr)->m_func);
  if (this->hoistHeadSegmentLoadOutOfLoop == (Loop *)0x0) {
    if (loadHeadSegment != (Instr *)0x0) {
      IR::Instr::SetByteCodeOffset(loadHeadSegment,*this->instr);
      IR::Instr::InsertBefore(this->insertBeforeInstr,loadHeadSegment);
    }
    IR::Instr::SetByteCodeOffset(this_02,*this->instr);
    IR::Instr::InsertBefore(this->insertBeforeInstr,this_02);
    *(ushort *)&(*this->instr)->field_0x36 = *(ushort *)&(*this->instr)->field_0x36 & 0xfbff | 0x400
    ;
  }
  else {
    if (((this->isLikelyJsArray & 1U) != 0) &&
       (bVar2 = JsArrayKills::KillsArrayHeadSegments
                          (&this->hoistHeadSegmentLoadOutOfLoop->jsArrayKills), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x66f,
                         "(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()))"
                         ,
                         "!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments())"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ArraySegmentHoistPhase,uVar5,uVar6);
    if (bVar2) {
      pJVar11 = Func::GetJITFunctionBody(this->func);
      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pcVar13 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_148);
      Output::Print(L"Function %s (%s)",pcVar12,pcVar13);
      bVar2 = Func::IsLoopBody(this->func);
      if (bVar2) {
        pJVar10 = Func::GetWorkItem(this->func);
        uVar5 = JITTimeWorkItem::GetLoopNumber(pJVar10);
        Output::Print(L", loop %u",(ulong)uVar5);
      }
      if ((*this->instr)->m_func != this->func) {
        pJVar11 = Func::GetJITFunctionBody((*this->instr)->m_func);
        pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
        pcVar13 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_148);
        Output::Print(L", Inlinee %s (%s)",pcVar12,pcVar13);
      }
      Output::Print(L" - %s\n    ",0x176ff74);
      IR::Instr::Dump(*this->instr);
      Output::Print(L"    ");
      uVar5 = Loop::GetLoopNumber(this->hoistHeadSegmentLoadOutOfLoop);
      uVar7 = BasicBlock::GetBlockNum(this->hoistHeadSegmentLoadOutOfLoop->landingPad);
      Output::Print(L"Hoisting array segment load out of loop %u to landing pad block %u\n",
                    (ulong)uVar5,(ulong)uVar7);
      Output::Flush();
    }
    uVar5 = Func::GetSourceContextId(this->func);
    uVar6 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ArraySegmentHoistPhase,uVar5,uVar6);
    if (bVar2) {
      pJVar11 = Func::GetJITFunctionBody((*this->instr)->m_func);
      pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
      pcVar13 = Func::GetDebugNumberSet((*this->instr)->m_func,(wchar (*) [42])local_1a8);
      Output::Print(L"Testtrace: %s function %s (%s): ",0x176ff74,pcVar12,pcVar13);
      Output::Print(L"Hoisting array segment load out of loop\n");
      Output::Flush();
    }
    if (loadHeadSegment != (Instr *)0x0) {
      InsertInstrInLandingPad(this,loadHeadSegment,this->hoistHeadSegmentLoadOutOfLoop);
    }
    InsertInstrInLandingPad(this,this_02,this->hoistHeadSegmentLoadOutOfLoop);
  }
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::InsertHeadSegmentLoad()
{
    TRACE_TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Separating array segment load\n"));

    Assert(newHeadSegmentSym);
    IR::RegOpnd *const headSegmentOpnd = IR::RegOpnd::New(newHeadSegmentSym, newHeadSegmentSym->GetType(), instr->m_func);
    headSegmentOpnd->SetIsJITOptimizedReg(true);

    IR::RegOpnd *const jitOptimizedBaseOpnd = baseOpnd->Copy(instr->m_func)->AsRegOpnd();
    jitOptimizedBaseOpnd->SetIsJITOptimizedReg(true);

    IR::Instr *loadObjectArray;
    if (baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        loadObjectArray =
            IR::Instr::New(
                Js::OpCode::LdIndir,
                headSegmentOpnd,
                IR::IndirOpnd::New(
                    jitOptimizedBaseOpnd,
                    Js::DynamicObject::GetOffsetOfObjectArray(),
                    jitOptimizedBaseOpnd->GetType(),
                    instr->m_func),
                instr->m_func);
    }
    else
    {
        loadObjectArray = nullptr;
    }

    IR::Instr *const loadHeadSegment =
        IR::Instr::New(
            Js::OpCode::LdIndir,
            headSegmentOpnd,
            IR::IndirOpnd::New(
                loadObjectArray ? headSegmentOpnd : jitOptimizedBaseOpnd,
                Lowerer::GetArrayOffsetOfHeadSegment(baseValueType),
                headSegmentOpnd->GetType(),
                instr->m_func),
            instr->m_func);

    if (hoistHeadSegmentLoadOutOfLoop)
    {
        Assert(!(isLikelyJsArray && hoistHeadSegmentLoadOutOfLoop->jsArrayKills.KillsArrayHeadSegments()));

        TRACE_PHASE_INSTR(
            Js::ArraySegmentHoistPhase,
            instr,
            _u("Hoisting array segment load out of loop %u to landing pad block %u\n"),
            hoistHeadSegmentLoadOutOfLoop->GetLoopNumber(),
            hoistHeadSegmentLoadOutOfLoop->landingPad->GetBlockNum());

        TESTTRACE_PHASE_INSTR(Js::ArraySegmentHoistPhase, instr, _u("Hoisting array segment load out of loop\n"));

        if (loadObjectArray)
        {
            InsertInstrInLandingPad(loadObjectArray, hoistHeadSegmentLoadOutOfLoop);
        }

        InsertInstrInLandingPad(loadHeadSegment, hoistHeadSegmentLoadOutOfLoop);
    }
    else
    {
        if (loadObjectArray)
        {
            loadObjectArray->SetByteCodeOffset(instr);
            insertBeforeInstr->InsertBefore(loadObjectArray);
        }

        loadHeadSegment->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(loadHeadSegment);
        instr->loadedArrayHeadSegment = true;
    }
}